

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::BuildLong1Float1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  IRType type;
  RegOpnd *this_00;
  undefined4 *puVar4;
  Instr *pIVar5;
  Instr *instr;
  RegOpnd *tmpDst;
  bool trapping;
  RegOpnd *pRStack_30;
  OpCode op;
  RegOpnd *dstOpnd;
  RegOpnd *srcOpnd;
  RegSlot src1RegSlot_local;
  RegSlot dstRegSlot_local;
  uint32 offset_local;
  OpCodeAsmJs newOpcode_local;
  IRBuilderAsmJs *this_local;
  
  this_00 = BuildSrcOpnd(this,src1RegSlot,TyFloat32);
  pRStack_30 = (RegOpnd *)0x0;
  tmpDst._6_2_ = Nop;
  bVar2 = false;
  switch(newOpcode) {
  case Conv_Check_FTL:
    pRStack_30 = BuildDstOpnd(this,dstRegSlot,TyInt64);
    tmpDst._6_2_ = Conv_Prim;
    bVar2 = true;
    break;
  case Conv_Check_FTUL:
    pRStack_30 = BuildDstOpnd(this,dstRegSlot,TyUint64);
    tmpDst._6_2_ = Conv_Prim;
    bVar2 = true;
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xd41,"((0))","(0)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
    break;
  case Conv_Sat_FTL:
    pRStack_30 = BuildDstOpnd(this,dstRegSlot,TyInt64);
    tmpDst._6_2_ = Conv_Prim_Sat;
    break;
  case Conv_Sat_FTUL:
    pRStack_30 = BuildDstOpnd(this,dstRegSlot,TyUint64);
    tmpDst._6_2_ = Conv_Prim_Sat;
  }
  dstOpnd = this_00;
  if (bVar2) {
    type = IR::Opnd::GetType(&this_00->super_Opnd);
    dstOpnd = IR::RegOpnd::New(type,this->m_func);
    IR::Opnd::SetValueType(&dstOpnd->super_Opnd,ValueType::Float);
    pIVar5 = IR::Instr::New(TrapIfTruncOverflow,&dstOpnd->super_Opnd,&this_00->super_Opnd,
                            this->m_func);
    AddInstr(this,pIVar5,offset);
    pRStack_30->field_0x18 = pRStack_30->field_0x18 & 0xfb | 4;
  }
  pIVar5 = IR::Instr::New(tmpDst._6_2_,&pRStack_30->super_Opnd,&dstOpnd->super_Opnd,this->m_func);
  AddInstr(this,pIVar5,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildLong1Float1(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot src1RegSlot)
{
    IR::RegOpnd * srcOpnd = BuildSrcOpnd(src1RegSlot, TyFloat32);
    IR::RegOpnd * dstOpnd = nullptr;
    Js::OpCode op = Js::OpCode::Nop;
    bool trapping = false;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::Conv_Check_FTL:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyInt64);
        op = Js::OpCode::Conv_Prim;
        trapping = true;
        break;
    case Js::OpCodeAsmJs::Conv_Check_FTUL:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyUint64);
        op = Js::OpCode::Conv_Prim;
        trapping = true;
        break;
    case Js::OpCodeAsmJs::Conv_Sat_FTL:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyInt64);
        op = Js::OpCode::Conv_Prim_Sat;
        break;
    case Js::OpCodeAsmJs::Conv_Sat_FTUL:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyUint64);
        op = Js::OpCode::Conv_Prim_Sat;
        break;
    default:
        Assume(UNREACHED);
    }

    if (trapping)
    {
        IR::RegOpnd* tmpDst = IR::RegOpnd::New(srcOpnd->GetType(), m_func);
        tmpDst->SetValueType(ValueType::Float);
        AddInstr(IR::Instr::New(Js::OpCode::TrapIfTruncOverflow, tmpDst, srcOpnd, m_func), offset);
        dstOpnd->m_dontDeadStore = true;
        srcOpnd = tmpDst;
    }
    IR::Instr * instr = IR::Instr::New(op, dstOpnd, srcOpnd, m_func);
    AddInstr(instr, offset);
}